

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O1

void * __thiscall
cbtHashedOverlappingPairCache::removeOverlappingPair
          (cbtHashedOverlappingPairCache *this,cbtBroadphaseProxy *proxy0,cbtBroadphaseProxy *proxy1
          ,cbtDispatcher *dispatcher)

{
  long lVar1;
  cbtBroadphasePair *pcVar2;
  int *piVar3;
  cbtOverlappingPairCallback *pcVar4;
  int *piVar5;
  cbtCollisionAlgorithm *pcVar6;
  anon_union_8_2_ea5a2114_for_cbtBroadphasePair_3 aVar7;
  int proxyId1;
  void *pvVar8;
  int iVar9;
  int *piVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int proxyId2;
  int iVar14;
  cbtBroadphasePair *pcVar15;
  ulong uVar16;
  long lVar17;
  cbtBroadphaseProxy *pcVar18;
  
  pcVar18 = proxy1;
  if (proxy1->m_uniqueId < proxy0->m_uniqueId) {
    pcVar18 = proxy0;
    proxy0 = proxy1;
  }
  uVar11 = pcVar18->m_uniqueId << 0x10 | proxy0->m_uniqueId;
  uVar11 = ~(uVar11 << 0xf) + uVar11;
  uVar11 = (uVar11 >> 10 ^ uVar11) * 9;
  uVar11 = uVar11 >> 6 ^ uVar11;
  uVar11 = ~(uVar11 << 0xb) + uVar11;
  uVar16 = (long)(int)(uVar11 >> 0x10 ^ uVar11) &
           (long)(this->m_overlappingPairArray).m_capacity - 1U;
  iVar14 = (this->m_hashTable).m_data[uVar16];
  if (iVar14 != -1) {
    pcVar2 = (this->m_overlappingPairArray).m_data;
    do {
      if (((pcVar2[iVar14].m_pProxy0)->m_uniqueId == proxy0->m_uniqueId) &&
         (pcVar15 = pcVar2 + iVar14, pcVar15->m_pProxy1->m_uniqueId == pcVar18->m_uniqueId))
      goto LAB_008c4e47;
      iVar14 = (this->m_next).m_data[iVar14];
    } while (iVar14 != -1);
  }
  pcVar15 = (cbtBroadphasePair *)0x0;
LAB_008c4e47:
  if (pcVar15 == (cbtBroadphasePair *)0x0) {
    pvVar8 = (void *)0x0;
  }
  else {
    (*(this->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
      _vptr_cbtOverlappingPairCallback[8])(this,pcVar15,dispatcher);
    piVar5 = (this->m_hashTable).m_data + uVar16;
    iVar14 = *piVar5;
    iVar9 = -1;
    iVar12 = (int)((ulong)((long)pcVar15 - (long)(this->m_overlappingPairArray).m_data) >> 5);
    if (iVar14 != iVar12) {
      do {
        iVar9 = iVar14;
        iVar14 = (this->m_next).m_data[iVar9];
      } while (iVar14 != iVar12);
    }
    pvVar8 = (pcVar15->field_3).m_internalInfo1;
    piVar3 = (this->m_next).m_data;
    piVar10 = piVar3 + iVar9;
    if (iVar9 == -1) {
      piVar10 = piVar5;
    }
    *piVar10 = piVar3[iVar12];
    lVar17 = (long)(this->m_overlappingPairArray).m_size;
    lVar1 = lVar17 + -1;
    pcVar4 = this->m_ghostPairCallback;
    if (pcVar4 != (cbtOverlappingPairCallback *)0x0) {
      (*pcVar4->_vptr_cbtOverlappingPairCallback[3])(pcVar4,proxy0,pcVar18,dispatcher);
    }
    iVar14 = (int)lVar1;
    if (iVar14 != iVar12) {
      pcVar15 = (this->m_overlappingPairArray).m_data;
      pcVar2 = pcVar15 + lVar1;
      uVar11 = (pcVar15[lVar1].m_pProxy1)->m_uniqueId << 0x10 |
               (pcVar15[lVar1].m_pProxy0)->m_uniqueId;
      uVar11 = ~(uVar11 << 0xf) + uVar11;
      uVar11 = (uVar11 >> 10 ^ uVar11) * 9;
      uVar11 = uVar11 >> 6 ^ uVar11;
      uVar11 = ~(uVar11 << 0xb) + uVar11;
      uVar16 = (long)(int)(uVar11 >> 0x10 ^ uVar11) &
               (long)(this->m_overlappingPairArray).m_capacity - 1U;
      piVar5 = (this->m_hashTable).m_data + uVar16;
      iVar9 = *piVar5;
      iVar13 = -1;
      if (iVar9 != iVar14) {
        do {
          iVar13 = iVar9;
          iVar9 = (this->m_next).m_data[iVar13];
        } while (iVar9 != iVar14);
      }
      piVar3 = (this->m_next).m_data;
      piVar10 = piVar3 + iVar13;
      if (iVar13 == -1) {
        piVar10 = piVar5;
      }
      *piVar10 = piVar3[lVar17 + -1];
      pcVar18 = pcVar2->m_pProxy1;
      pcVar6 = pcVar2->m_algorithm;
      aVar7 = pcVar2->field_3;
      pcVar15 = pcVar15 + iVar12;
      pcVar15->m_pProxy0 = pcVar2->m_pProxy0;
      pcVar15->m_pProxy1 = pcVar18;
      pcVar15->m_algorithm = pcVar6;
      pcVar15->field_3 = aVar7;
      piVar5 = (this->m_hashTable).m_data;
      (this->m_next).m_data[iVar12] = piVar5[uVar16];
      piVar5[uVar16] = iVar12;
    }
    piVar5 = &(this->m_overlappingPairArray).m_size;
    *piVar5 = *piVar5 + -1;
  }
  return pvVar8;
}

Assistant:

void* cbtHashedOverlappingPairCache::removeOverlappingPair(cbtBroadphaseProxy* proxy0, cbtBroadphaseProxy* proxy1, cbtDispatcher* dispatcher)
{
	if (proxy0->m_uniqueId > proxy1->m_uniqueId)
		cbtSwap(proxy0, proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2)
		cbtSwap(proxyId1, proxyId2);*/

	int hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1), static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity() - 1));

	cbtBroadphasePair* pair = internalFindPair(proxy0, proxy1, hash);
	if (pair == NULL)
	{
		return 0;
	}

	cleanOverlappingPair(*pair, dispatcher);

	void* userData = pair->m_internalInfo1;

	cbtAssert(pair->m_pProxy0->getUid() == proxyId1);
	cbtAssert(pair->m_pProxy1->getUid() == proxyId2);

	int pairIndex = int(pair - &m_overlappingPairArray[0]);
	cbtAssert(pairIndex < m_overlappingPairArray.size());

	// Remove the pair from the hash table.
	int index = m_hashTable[hash];
	cbtAssert(index != BT_NULL_PAIR);

	int previous = BT_NULL_PAIR;
	while (index != pairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_NULL_PAIR)
	{
		cbtAssert(m_next[previous] == pairIndex);
		m_next[previous] = m_next[pairIndex];
	}
	else
	{
		m_hashTable[hash] = m_next[pairIndex];
	}

	// We now move the last pair into spot of the
	// pair being removed. We need to fix the hash
	// table indices to support the move.

	int lastPairIndex = m_overlappingPairArray.size() - 1;

	if (m_ghostPairCallback)
		m_ghostPairCallback->removeOverlappingPair(proxy0, proxy1, dispatcher);

	// If the removed pair is the last pair, we are done.
	if (lastPairIndex == pairIndex)
	{
		m_overlappingPairArray.pop_back();
		return userData;
	}

	// Remove the last pair from the hash table.
	const cbtBroadphasePair* last = &m_overlappingPairArray[lastPairIndex];
	/* missing swap here too, Nat. */
	int lastHash = static_cast<int>(getHash(static_cast<unsigned int>(last->m_pProxy0->getUid()), static_cast<unsigned int>(last->m_pProxy1->getUid())) & (m_overlappingPairArray.capacity() - 1));

	index = m_hashTable[lastHash];
	cbtAssert(index != BT_NULL_PAIR);

	previous = BT_NULL_PAIR;
	while (index != lastPairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_NULL_PAIR)
	{
		cbtAssert(m_next[previous] == lastPairIndex);
		m_next[previous] = m_next[lastPairIndex];
	}
	else
	{
		m_hashTable[lastHash] = m_next[lastPairIndex];
	}

	// Copy the last pair into the remove pair's spot.
	m_overlappingPairArray[pairIndex] = m_overlappingPairArray[lastPairIndex];

	// Insert the last pair into the hash table
	m_next[pairIndex] = m_hashTable[lastHash];
	m_hashTable[lastHash] = pairIndex;

	m_overlappingPairArray.pop_back();

	return userData;
}